

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GPrim *gprim,uint32_t indent,
          bool closing_brace)

{
  ostream *poVar1;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  stringstream ss;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)gprim & 0xffffffff),n);
  poVar1 = std::operator<<(local_1a8,(string *)&local_1f8);
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  poVar1 = std::operator<<(poVar1," GPrim \"");
  poVar1 = std::operator<<(poVar1,(string *)(this + 0xa78));
  std::operator<<(poVar1,"\"\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)gprim & 0xffffffff),n_00);
  poVar1 = std::operator<<(local_1a8,(string *)&local_1f8);
  std::operator<<(poVar1,"(\n");
  std::__cxx11::string::_M_dispose();
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)gprim & 0xffffffff),n_01);
  poVar1 = std::operator<<(local_1a8,(string *)&local_1f8);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::_M_dispose();
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)gprim & 0xffffffff),n_02);
  poVar1 = std::operator<<(local_1a8,(string *)&local_1f8);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::_M_dispose();
  print_gprim_predefined<tinyusdz::GPrim>(&local_1f8,(GPrim *)this,(int)gprim + 1);
  std::operator<<(local_1a8,(string *)&local_1f8);
  std::__cxx11::string::_M_dispose();
  if (indent != 0) {
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)gprim & 0xffffffff),n_03);
    poVar1 = std::operator<<(local_1a8,(string *)&local_1f8);
    std::operator<<(poVar1,"}\n");
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GPrim &gprim, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(gprim.spec) << " GPrim \""
     << gprim.name << "\"\n";
  ss << pprint::Indent(indent) << "(\n";
  // args
  ss << pprint::Indent(indent) << ")\n";
  ss << pprint::Indent(indent) << "{\n";

  ss << print_gprim_predefined(gprim, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}